

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_writer_init_stdfile(mpack_writer_t *writer,FILE *file,_Bool close_when_done)

{
  char *buffer_00;
  code *teardown;
  char *buffer;
  size_t capacity;
  _Bool close_when_done_local;
  FILE *file_local;
  mpack_writer_t *writer_local;
  
  buffer_00 = (char *)malloc(0x1000);
  if (buffer_00 == (char *)0x0) {
    mpack_writer_init_error(writer,mpack_error_memory);
    if (close_when_done) {
      fclose((FILE *)file);
    }
  }
  else {
    mpack_writer_init(writer,buffer_00,0x1000);
    mpack_writer_set_context(writer,file);
    mpack_writer_set_flush(writer,mpack_file_writer_flush);
    teardown = mpack_file_writer_teardown;
    if (close_when_done) {
      teardown = mpack_file_writer_teardown_close;
    }
    mpack_writer_set_teardown(writer,teardown);
  }
  return;
}

Assistant:

void mpack_writer_init_stdfile(mpack_writer_t* writer, FILE* file, bool close_when_done) {
    mpack_assert(file != NULL, "file is NULL");

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_writer_init_error(writer, mpack_error_memory);
        if (close_when_done) {
            fclose(file);
        }
        return;
    }

    mpack_writer_init(writer, buffer, capacity);
    mpack_writer_set_context(writer, file);
    mpack_writer_set_flush(writer, mpack_file_writer_flush);
    mpack_writer_set_teardown(writer, close_when_done ?
            mpack_file_writer_teardown_close :
            mpack_file_writer_teardown);
}